

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::EllipsoidRecord1::SetSigma(EllipsoidRecord1 *this,Vector *S)

{
  KFLOAT32 KVar1;
  
  (this->m_Sigma).m_f32Z = S->m_f32Z;
  KVar1 = S->m_f32Y;
  (this->m_Sigma).m_f32X = S->m_f32X;
  (this->m_Sigma).m_f32Y = KVar1;
  return;
}

Assistant:

class KDIS_EXPORT Vector : public DataTypeBase
{
protected:

    KFLOAT32 m_f32X;

    KFLOAT32 m_f32Y;

    KFLOAT32 m_f32Z;

public:

    static const KUINT16 VECTOR_SIZE = 12;

    Vector();

    Vector( KFLOAT32 X, KFLOAT32 Y, KFLOAT32 Z );

    explicit Vector(KDataStream &stream) noexcept(false);

    ~Vector() override = default;

    //************************************
    // FullName:    KDIS::DATA_TYPE::Vector::SetX
    //              KDIS::DATA_TYPE::Vector::GetX
    // Description: First Value / X
    // Parameter:   KFLOAT32  X
    //************************************
    void SetX( KFLOAT32 X );
    KFLOAT32 GetX() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::Vector::SetY
    //              KDIS::DATA_TYPE::Vector::GetY
    // Description: Second Value / Y
    // Parameter:   KFLOAT32 Y
    //************************************
    void SetY( KFLOAT32 Y );
    KFLOAT32 GetY() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::Vector::SetZ
    //              KDIS::DATA_TYPE::Vector::GetZ
    // Description: Third Value / Z
    // Parameter:   KFLOAT32 Z
    //************************************
    void SetZ( KFLOAT32 Z );
    KFLOAT32 GetZ() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::Vector::Set
    // Description: Sets x,y and z.
    // Parameter:   KFLOAT32 X
    // Parameter:   KFLOAT32 Y
    // Parameter:   KFLOAT32 Z
    //************************************
    void Set( KFLOAT32 X, KFLOAT32 Y, KFLOAT32 Z );

    //************************************
    // FullName:    KDIS::DATA_TYPE::Vector::GetMagnitude
    // Description: Calculates and returns the magnitude or length.
    //              E.G If the vector represented a velocity then this would be the speed.
    //************************************
    KFLOAT32 GetMagnitude() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::Vector::GetDistance
    // Description: Calculates the distance from this vector to an other.
    // Parameter:   KFLOAT32 Z
    //************************************
    KFLOAT32 GetDistance( const Vector & Other );

    //************************************
    // FullName:    KDIS::DATA_TYPE::Vector::Lerp
    // Description: Linearly interpolate between From and To by T.
    //              T should be between 0 and 1(its not checked).
    //              T 0 = From
    //              1 = to
    //              0.5 = halfway between From and To.
    // Parameter:   const Vector & From
    // Parameter:   const Vector & To
    // Parameter:   KFLOAT32 T
    //************************************
    static Vector Lerp( const Vector & From, const Vector & To, KFLOAT32 T );
    void Lerp( const Vector & To, KFLOAT32 T );

    //************************************
    // FullName:    KDIS::DATA_TYPE::Vector::GetAsString
    // Description: Returns a string representation
    //************************************
    KString GetAsString() const override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::Vector::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    void Decode(KDataStream &stream) noexcept(false) override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::Vector::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    KDataStream Encode() const override;

    void Encode(KDataStream &stream) const override;

    KBOOL operator == ( const Vector & Value ) const;
    KBOOL operator != ( const Vector & Value ) const;
    Vector operator * ( const Vector & Value ) const;
    Vector operator * ( KFLOAT64 Value ) const;
    Vector operator * ( KFLOAT32 Value ) const;
    Vector operator + ( const Vector & Value ) const;
    Vector & operator += ( const Vector & Value );
    Vector operator - ( const Vector & Value ) const;
    Vector & operator -= ( const Vector & Value );

    // Valid values 0 - X, 1 - Y, 2 - Z. throws OUT_OF_BOUNDS exception for any other value.
    KFLOAT32 &operator[](KUINT16 i) noexcept(false);

    const KFLOAT32 &operator[](KUINT16 i) const noexcept(false);
}